

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_item.cpp
# Opt level: O2

int menu_item_left_offset_proc(Am_Object *self)

{
  bool menuBarItem;
  int iVar1;
  Am_Value *in_value;
  Am_Widget_Look look;
  Am_Object local_20;
  Am_Object local_18;
  Am_Widget_Look local_c;
  
  in_value = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&local_c,in_value);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)self);
  Am_Object::Am_Object(&local_20,&Am_Menu_Bar);
  menuBarItem = Am_Object::Is_Instance_Of(&local_18,&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_18);
  iVar1 = menu_item_left_offset_internal(&local_c,menuBarItem);
  return iVar1;
}

Assistant:

Am_Define_Formula(int, menu_item_left_offset)
{
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  bool menuBarItem = false;
  if (self.Get_Owner().Is_Instance_Of(Am_Menu_Bar))
    // is this item in the menu bar
    menuBarItem = true;
  return menu_item_left_offset_internal(look, menuBarItem);
}